

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

string * lsvm::string::new_string(char *str)

{
  byte bVar1;
  string *psVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  byte *pbVar5;
  
  uVar3 = 0;
  pbVar5 = (byte *)str;
  while( true ) {
    bVar1 = *pbVar5;
    if (bVar1 == 0) {
      uVar4 = (uint32_t)((long)pbVar5 - (long)str);
      psVar2 = (string *)memory::allocate(((long)pbVar5 - (long)str & 0xffffffffU) + 9);
      psVar2->count = uVar3;
      psVar2->size = uVar4;
      memcpy(psVar2 + 1,str,(ulong)(uVar4 + 1));
      return psVar2;
    }
    if ((char)bVar1 < '\0') break;
    pbVar5 = pbVar5 + 1;
    uVar3 = uVar3 + 1;
  }
  if (bVar1 < 0xc2) {
    return (string *)0x0;
  }
  if (bVar1 < 0xe0) {
    return (string *)0x0;
  }
  if (bVar1 < 0xf0) {
    return (string *)0x0;
  }
  return (string *)0x0;
}

Assistant:

string* new_string(const char* str){
    uint32_t count = 0;
    uint8_t* s = reinterpret_cast<uint8_t*>(const_cast<char*>(str));
    uint8_t* s2;
    uint8_t* s3;
    uint8_t* s4;
    while(*s != 0){
        if (*s < 0x80) {
            ++s;
        } else if (*s < 0xC2) {
            /* continuation or overlong 2-byte sequence */
            return null;
        } else if (*s < 0xE0) {
            /* 2-byte sequence */
            s2 = s+1;
            if ((*s2 & 0xC0) != 0x80)
                return null;
            s += 2;
        } else if (*s < 0xF0) {
            /* 3-byte sequence */
            s2 = s+1;
            if ((*s2 & 0xC0) != 0x80)
                return null;
            if (*s == 0xE0 && *s2 < 0xA0)
                return null; /* overlong */
            s3 = s2+1;
            if ((*s3 & 0xC0) != 0x80)
               return null; 
            s += 3;
        } else if (*s < 0xF5) {
            /* 4-byte sequence */
            s2 = s+1;
            if ((*s2 & 0xC0) != 0x80)
                return null;
            if (*s == 0xF0 && *s2 < 0x90)
                return null; /* overlong */
            if (*s == 0xF4 && *s2 >= 0x90)
                return null; /* > U+10FFFF */
            s3 = s2+1;
            if ((*s3 & 0xC0) != 0x80)
                return null;
            s4 = s3+1;
            if ((*s4 & 0xC0) != 0x80)
                return null;
            s += 4;
        } else {
            return null;
        }
        ++count; 
    }

    uint32_t size = static_cast<uint32_t>(s - reinterpret_cast<uint8_t*>(const_cast<char*>(str)));

    string* r = (string*) lsvm::memory::allocate(sizeof(string)+size+1);
    r->count = count;
    r->size = size;

    memcpy(c_str(r),str,size+1);

    return r;
}